

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::SliceDynamicLayerParams::Clear(SliceDynamicLayerParams *this)

{
  SliceDynamicLayerParams *this_local;
  
  google::protobuf::RepeatedField<bool>::Clear(&this->beginmasks_);
  google::protobuf::RepeatedField<long>::Clear(&this->endids_);
  google::protobuf::RepeatedField<bool>::Clear(&this->endmasks_);
  google::protobuf::RepeatedField<long>::Clear(&this->strides_);
  google::protobuf::RepeatedField<bool>::Clear(&this->squeezemasks_);
  return;
}

Assistant:

void SliceDynamicLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.SliceDynamicLayerParams)
  beginmasks_.Clear();
  endids_.Clear();
  endmasks_.Clear();
  strides_.Clear();
  squeezemasks_.Clear();
}